

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

int Mio_CheckPins(Mio_Pin_t *pPin1,Mio_Pin_t *pPin2)

{
  Mio_Pin_t *pPin2_local;
  Mio_Pin_t *pPin1_local;
  
  if ((pPin1 == (Mio_Pin_t *)0x0) || (pPin2 == (Mio_Pin_t *)0x0)) {
    pPin1_local._4_4_ = 1;
  }
  else if ((pPin1->dLoadInput != pPin2->dLoadInput) ||
          (NAN(pPin1->dLoadInput) || NAN(pPin2->dLoadInput))) {
    pPin1_local._4_4_ = 0;
  }
  else if ((pPin1->dLoadMax != pPin2->dLoadMax) || (NAN(pPin1->dLoadMax) || NAN(pPin2->dLoadMax))) {
    pPin1_local._4_4_ = 0;
  }
  else if ((pPin1->dDelayBlockRise != pPin2->dDelayBlockRise) ||
          (NAN(pPin1->dDelayBlockRise) || NAN(pPin2->dDelayBlockRise))) {
    pPin1_local._4_4_ = 0;
  }
  else if ((pPin1->dDelayFanoutRise != pPin2->dDelayFanoutRise) ||
          (NAN(pPin1->dDelayFanoutRise) || NAN(pPin2->dDelayFanoutRise))) {
    pPin1_local._4_4_ = 0;
  }
  else if ((pPin1->dDelayBlockFall != pPin2->dDelayBlockFall) ||
          (NAN(pPin1->dDelayBlockFall) || NAN(pPin2->dDelayBlockFall))) {
    pPin1_local._4_4_ = 0;
  }
  else if ((pPin1->dDelayFanoutFall != pPin2->dDelayFanoutFall) ||
          (NAN(pPin1->dDelayFanoutFall) || NAN(pPin2->dDelayFanoutFall))) {
    pPin1_local._4_4_ = 0;
  }
  else {
    pPin1_local._4_4_ = 1;
  }
  return pPin1_local._4_4_;
}

Assistant:

int Mio_CheckPins( Mio_Pin_t * pPin1, Mio_Pin_t * pPin2 )
{
    if ( pPin1 == NULL || pPin2 == NULL )
        return 1;
    if ( pPin1->dLoadInput != pPin2->dLoadInput )
        return 0;
    if ( pPin1->dLoadMax != pPin2->dLoadMax )
        return 0;
    if ( pPin1->dDelayBlockRise != pPin2->dDelayBlockRise )
        return 0;
    if ( pPin1->dDelayFanoutRise != pPin2->dDelayFanoutRise )
        return 0;
    if ( pPin1->dDelayBlockFall != pPin2->dDelayBlockFall )
        return 0;
    if ( pPin1->dDelayFanoutFall != pPin2->dDelayFanoutFall )
        return 0;
    return 1;
}